

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_ID_REQ.cpp
# Opt level: O0

bool __thiscall SRUP_MSG_SYNDICATED_ID_REQ::Serialize(SRUP_MSG_SYNDICATED_ID_REQ *this,bool preSign)

{
  uint8_t uVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint8_t *LSB;
  uint8_t *puVar4;
  int local_4c;
  uint8_t byte_2;
  int x_2;
  uint8_t byte_1;
  int x_1;
  uint8_t byte;
  int x;
  uint8_t *lsb;
  uint8_t *msb;
  uint32_t p;
  uint32_t serial_len;
  uint8_t var_length_field_count;
  uint8_t len_target;
  uint8_t field_length_size;
  uint16_t header_size;
  bool preSign_local;
  SRUP_MSG_SYNDICATED_ID_REQ *this_local;
  
  p._1_1_ = 2;
  if ((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token == (uint8_t *)0x0)
  {
    this_local._7_1_ = false;
  }
  else {
    puVar3 = (uint8_t *)operator_new__(1);
    LSB = (uint8_t *)operator_new__(1);
    if ((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sequence_ID ==
        (uint64_t *)0x0) {
      if (puVar3 != (uint8_t *)0x0) {
        operator_delete__(puVar3);
      }
      if (LSB != (uint8_t *)0x0) {
        operator_delete__(LSB);
      }
      this_local._7_1_ = false;
    }
    else if ((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sender_ID ==
             (uint64_t *)0x0) {
      if (puVar3 != (uint8_t *)0x0) {
        operator_delete__(puVar3);
      }
      if (LSB != (uint8_t *)0x0) {
        operator_delete__(LSB);
      }
      this_local._7_1_ = false;
    }
    else if (this->m_target_ID == (uint64_t *)0x0) {
      if (puVar3 != (uint8_t *)0x0) {
        operator_delete__(puVar3);
      }
      if (LSB != (uint8_t *)0x0) {
        operator_delete__(LSB);
      }
      this_local._7_1_ = false;
    }
    else {
      if (preSign) {
        uVar2 = (uint)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token_len
        ;
        p._1_1_ = 1;
      }
      else {
        uVar2 = (uint)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sig_len +
                (uint)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token_len
        ;
      }
      (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serial_length =
           uVar2 + 0x1a + (uint)p._1_1_ * 2;
      puVar4 = (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized;
      if (puVar4 != (uint8_t *)0x0) {
        operator_delete__(puVar4);
      }
      puVar4 = (uint8_t *)
               operator_new__((ulong)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.
                                     super_SRUP_MSG.m_serial_length);
      (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized = puVar4;
      memset((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized,0,
             (ulong)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.
                    m_serial_length);
      *(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized =
           *(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_version;
      (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized[1] =
           *(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_msgtype;
      msb._0_4_ = 2;
      for (x_1 = 0; x_1 < 8; x_1 = x_1 + 1) {
        uVar1 = SRUP_MSG::getByteVal
                          (*(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.
                            m_sequence_ID,(uint8_t)x_1);
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized[(uint)msb] =
             uVar1;
        msb._0_4_ = (uint)msb + 1;
      }
      for (x_2 = 0; x_2 < 8; x_2 = x_2 + 1) {
        uVar1 = SRUP_MSG::getByteVal
                          (*(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.
                            m_sender_ID,(uint8_t)x_2);
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized[(uint)msb] =
             uVar1;
        msb._0_4_ = (uint)msb + 1;
      }
      SRUP_MSG::encodeLength
                (LSB,puVar3,
                 (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token_len);
      (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized[(uint)msb] =
           *puVar3;
      (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized[(uint)msb + 1]
           = *LSB;
      memcpy((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized +
             ((uint)msb + 2),
             (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token,
             (ulong)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_token_len);
      msb._0_4_ = (uint)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.
                        m_token_len + (uint)msb + 2;
      if (!preSign) {
        if ((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_signature ==
            (uint8_t *)0x0) {
          if (puVar3 != (uint8_t *)0x0) {
            operator_delete__(puVar3);
          }
          if (LSB != (uint8_t *)0x0) {
            operator_delete__(LSB);
          }
          return false;
        }
        if ((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sig_len == 0) {
          if (puVar3 != (uint8_t *)0x0) {
            operator_delete__(puVar3);
          }
          if (LSB != (uint8_t *)0x0) {
            operator_delete__(LSB);
          }
          return false;
        }
        SRUP_MSG::encodeLength
                  (LSB,puVar3,
                   (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sig_len);
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized[(uint)msb] =
             *puVar3;
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized
        [(uint)msb + 1] = *LSB;
        memcpy((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized +
               ((uint)msb + 2),
               (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_signature,
               (ulong)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_sig_len);
        msb._0_4_ = (uint)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.
                          m_sig_len + (uint)msb + 2;
      }
      for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
        uVar1 = SRUP_MSG::getByteVal(*this->m_target_ID,(uint8_t)local_4c);
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized[(uint)msb] =
             uVar1;
        msb._0_4_ = (uint)msb + 1;
      }
      if (puVar3 != (uint8_t *)0x0) {
        operator_delete__(puVar3);
      }
      if (LSB != (uint8_t *)0x0) {
        operator_delete__(LSB);
      }
      if (preSign) {
        puVar3 = (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.
                 m_unsigned_message;
        if (puVar3 != (uint8_t *)0x0) {
          operator_delete__(puVar3);
        }
        puVar3 = (uint8_t *)
                 operator_new__((ulong)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.
                                       super_SRUP_MSG.m_serial_length);
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_unsigned_message =
             puVar3;
        memcpy((this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_unsigned_message
               ,(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized,
               (ulong)(this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.
                      m_serial_length);
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_unsigned_length =
             (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serial_length;
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serial_length = 0;
        puVar3 = (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized;
        if (puVar3 != (uint8_t *)0x0) {
          operator_delete__(puVar3);
        }
        (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_serialized =
             (uint8_t *)0x0;
      }
      (this->super_SRUP_MSG_ID_REQ).super_SRUP_MSG_SIMPLE.super_SRUP_MSG.m_is_serialized = true;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SRUP_MSG_SYNDICATED_ID_REQ::Serialize (bool preSign)
{
    // As we're using dynamic memory - and only storing / sending the length of the data we have
    // we need to know how long all of the fields are so that we can unmarshall the data at
    // the other end...

    const uint16_t header_size = 18; // Two-bytes for the main header - plus 8 for the sequence ID ...
                                     // 8 for the sender ID

    const uint8_t field_length_size = 2;

    const uint8_t len_target = 8; // 8 bytes for the 64-bit target ID.

    // We need the number of variable length fields - including the m_sig_len...
    // ... this can't be const as we need to change it depending on whether or not we're in pre-sign.
    // (If we are we need to reduce it by one for the unused m_sig_len
    uint8_t var_length_field_count = 2;

    uint32_t serial_len;
    uint32_t p=0;

    uint8_t * msb;
    uint8_t * lsb;

    if (m_token == nullptr)
        return false;

    msb=new uint8_t[1];
    lsb=new uint8_t[1];

    // Now check that we have a sequence ID...
    if (m_sequence_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...and check that we have a sender ID ...
    if (m_sender_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...and check that we have a target ID
    if (m_target_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // If we're calling this as a prelude to signing / verifying then we need to exclude the signature data from the
    // serial data we generate...

    if (preSign)
    {
        serial_len = m_token_len + len_target;
        var_length_field_count--;
    }
    else
        serial_len = m_sig_len + m_token_len + len_target;

    m_serial_length = serial_len + header_size + (field_length_size * var_length_field_count);

    delete[] m_serialized;

    m_serialized = new uint8_t[m_serial_length];
    std::memset(m_serialized, 0, m_serial_length);

    // The first two fields are fixed length (1 byte each).
    std::memcpy(m_serialized, m_version, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_msgtype, 1);
    p+=1;

    // Now we need to add the Sequence ID (uint64_t)
    // See SRUP_Init.cpp for details...
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sequence_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // And we need to do the same thing for the Sender ID (uint64_t)
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sender_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // All of the other fields need their length to be specified...

    // The token...
    encodeLength(lsb, msb, m_token_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_token, m_token_len);
    p+=m_token_len;

    // If we're executing Serialize as a part of generating the signature - we can't marshall the signature
    // as we haven't calculated it yet. So only do the signature if we're not in preSign

    if (!preSign)
    {
        if (m_signature == nullptr)
        {
            delete[] msb;
            delete[] lsb;
            return false;
        }
        else
        {
            if (m_sig_len == 0)
            {
                delete[] msb;
                delete[] lsb;
                return false;
            }
            else
            {
                encodeLength(lsb, msb, m_sig_len);
                std::memcpy(m_serialized + p, msb, 1);
                p += 1;
                std::memcpy(m_serialized + p, lsb, 1);
                p += 1;
                std::memcpy(m_serialized + p, m_signature, m_sig_len);
                p += m_sig_len;
            }
        }
    }

    // And lastly we need to add the target ID (uint64_t)
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_target_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }


    delete[] msb;
    delete[] lsb;

    // If we're in preSign we don't have a real value for m_serialized - so copy the data to m_unsigned_message
    // and discard (and reset) m_serialized & m_serial_length...
    if (preSign)
    {
        delete[] m_unsigned_message;
        m_unsigned_message = new unsigned char[m_serial_length];

        std::memcpy(m_unsigned_message, m_serialized, m_serial_length);
        m_unsigned_length = m_serial_length;

        m_serial_length = 0;
        delete[] m_serialized;
        m_serialized= nullptr;
    }

    m_is_serialized = true;
    return true;
}